

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

void __thiscall dg::vr::GraphBuilder::build(GraphBuilder *this)

{
  long lVar1;
  long lVar2;
  char cVar3;
  long *plVar4;
  Function *function;
  
  lVar1 = *(long *)this;
  plVar4 = (long *)(lVar1 + 0x20);
  while (lVar2 = *plVar4, lVar2 != lVar1 + 0x18) {
    function = (Function *)(lVar2 + -0x38);
    if (lVar2 == 0) {
      function = (Function *)0x0;
    }
    cVar3 = llvm::GlobalValue::isDeclaration();
    if (cVar3 == '\0') {
      buildBlocks(this,function);
      buildTerminators(this,function);
    }
    plVar4 = (long *)(lVar2 + 8);
  }
  return;
}

Assistant:

void GraphBuilder::build() {
    for (const llvm::Function &function : module) {
        if (function.isDeclaration())
            continue;

        buildBlocks(function);
        buildTerminators(function);
    }
}